

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

void __thiscall wasm::Literal::Literal(Literal *this,shared_ptr<wasm::GCData> *gcData,HeapType type)

{
  Literal *heapType;
  bool bVar1;
  element_type *this_00;
  bool local_5e;
  bool local_5a;
  shared_ptr<wasm::GCData> *gcData_local;
  Literal *this_local;
  HeapType type_local;
  
  this_local = (Literal *)type.id;
  std::shared_ptr<wasm::GCData>::shared_ptr((shared_ptr<wasm::GCData> *)this,gcData);
  heapType = this_local;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)gcData);
  wasm::Type::Type(&this->type,(HeapType)heapType,(uint)!bVar1,Inexact);
  bVar1 = isData(this);
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)gcData);
    local_5a = true;
    if (bVar1) goto LAB_0254f404;
  }
  bVar1 = HeapType::isMaybeShared((HeapType *)&this_local,ext);
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)gcData);
    local_5a = true;
    if (bVar1) goto LAB_0254f404;
  }
  bVar1 = HeapType::isBottom((HeapType *)&this_local);
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)gcData);
    local_5a = true;
    if (!bVar1) goto LAB_0254f404;
  }
  bVar1 = HeapType::isMaybeShared((HeapType *)&this_local,any);
  local_5e = false;
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)gcData);
    local_5e = false;
    if (bVar1) {
      this_00 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)gcData);
      local_5e = HeapType::isMaybeShared(&this_00->type,string);
    }
  }
  local_5a = local_5e;
LAB_0254f404:
  if (local_5a != false) {
    return;
  }
  __assert_fail("(isData() && gcData) || (type.isMaybeShared(HeapType::ext) && gcData) || (type.isBottom() && !gcData) || (type.isMaybeShared(HeapType::any) && gcData && gcData->type.isMaybeShared(HeapType::string))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                ,0x54,"wasm::Literal::Literal(std::shared_ptr<GCData>, HeapType)");
}

Assistant:

Literal::Literal(std::shared_ptr<GCData> gcData, HeapType type)
  : gcData(gcData), type(type, gcData ? NonNullable : Nullable) {
  // TODO: Use exact types for gcData.
  // The type must be a proper type for GC data: either a struct, array, or
  // string; or an externalized version of the same; or a null; or an
  // internalized string (which appears as an anyref).
  assert((isData() && gcData) ||
         (type.isMaybeShared(HeapType::ext) && gcData) ||
         (type.isBottom() && !gcData) ||
         (type.isMaybeShared(HeapType::any) && gcData &&
          gcData->type.isMaybeShared(HeapType::string)));
}